

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::handleElementStart(TestResultParser *this)

{
  bool bVar1;
  deBool dVar2;
  TestLogVersion TVar3;
  TestCaseType TVar4;
  TestStatusCode TVar5;
  Format FVar6;
  Compression CVar7;
  ShaderType SVar8;
  int iVar9;
  Type TVar10;
  ValueTag VVar11;
  TestResultParseError *pTVar12;
  char *pcVar13;
  char *local_428;
  Type local_3d4;
  allocator<char> local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  SampleValue *local_340;
  SampleValue *value;
  Sample *sample_1;
  string local_328;
  Sample *local_308;
  Sample *sample;
  SampleList *list_2;
  string local_2f0;
  ValueInfo *local_2d0;
  ValueInfo *valueInfo;
  SampleInfo *sampleInfo;
  string local_2b8;
  string *local_298;
  SampleInfo *info_1;
  SampleList *list_1;
  string local_280;
  SampleList *local_260;
  SampleList *list;
  EglConfig *config;
  EglConfigSet *set;
  CompileInfo *info;
  string local_238;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1ea;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Shader *local_188;
  Shader *shader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ShaderProgram *local_118;
  ShaderProgram *shaderProgram;
  Image *image;
  ImageSet *imageSet;
  Number *number;
  Section *section;
  Result *result;
  ValueInfo *pVStack_e0;
  Type parentType;
  Item *parentItem;
  Item *item;
  List *pLStack_c8;
  Type itemType;
  List *curList;
  string local_b8;
  char *local_98;
  char *version;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *elemName;
  TestResultParser *this_local;
  
  elemName = (char *)this;
  local_18 = xml::Parser::getElementName(&this->m_xmlParser);
  if (this->m_state == STATE_INITIALIZED) {
    dVar2 = deStringEqual(local_18,"TestCaseResult");
    if (dVar2 == 0) {
      version._3_1_ = 1;
      pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Expected <TestCaseResult>, got <",&local_79);
      std::operator+(&local_58,&local_78,local_18);
      std::operator+(&local_38,&local_58,">");
      TestResultParseError::TestResultParseError(pTVar12,&local_38);
      version._3_1_ = 0;
      __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                  TestResultParseError::~TestResultParseError);
    }
    local_98 = getAttribute(this,"Version");
    TVar3 = getTestLogVersion(local_98);
    this->m_logVersion = TVar3;
    pcVar13 = getAttribute(this,"CasePath");
    std::__cxx11::string::operator=((string *)this->m_result,pcVar13);
    (this->m_result->super_TestCaseResultHeader).caseType = TESTCASETYPE_SELF_VALIDATE;
    bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,"CaseType");
    if (bVar1) {
      pcVar13 = xml::Parser::getAttribute(&this->m_xmlParser,"CaseType");
      TVar4 = getTestCaseType(pcVar13);
      (this->m_result->super_TestCaseResultHeader).caseType = TVar4;
    }
    else {
      if (2 < (int)this->m_logVersion) {
        curList._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Missing CaseType attribute in <TestCaseResult>",
                   (allocator<char> *)((long)&curList + 7));
        TestResultParseError::TestResultParseError(pTVar12,&local_b8);
        curList._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      pcVar13 = (char *)std::__cxx11::string::c_str();
      TVar4 = getTestCaseTypeFromPath(pcVar13);
      (this->m_result->super_TestCaseResultHeader).caseType = TVar4;
    }
    this->m_state = STATE_IN_TEST_CASE_RESULT;
  }
  else {
    pLStack_c8 = getCurrentItemList(this);
    item._4_4_ = getResultItemType(local_18);
    parentItem = (Item *)0x0;
    pVStack_e0 = (ValueInfo *)getCurrentItem(this);
    if (pVStack_e0 == (ValueInfo *)0x0) {
      local_3d4 = TYPE_LAST;
    }
    else {
      local_3d4 = ri::Item::getType((Item *)pVStack_e0);
    }
    result._4_4_ = local_3d4;
    switch(item._4_4_) {
    case TYPE_RESULT:
      section = (Section *)ri::List::allocItem<xe::ri::Result>(pLStack_c8);
      pcVar13 = getAttribute(this,"StatusCode");
      TVar5 = getTestStatusCode(pcVar13);
      *(TestStatusCode *)&(section->super_Item).field_0xc = TVar5;
      parentItem = &section->super_Item;
      break;
    case TYPE_TEXT:
      parentItem = &ri::List::allocItem<xe::ri::Text>(pLStack_c8)->super_Item;
      break;
    case TYPE_NUMBER:
      imageSet = (ImageSet *)ri::List::allocItem<xe::ri::Number>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&imageSet->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&imageSet->description,pcVar13);
      pcVar13 = getAttribute(this,"Unit");
      std::__cxx11::string::operator=((string *)&imageSet->images,pcVar13);
      bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,"Tag");
      if (bVar1) {
        pcVar13 = xml::Parser::getAttribute(&this->m_xmlParser,"Tag");
        std::__cxx11::string::operator=((string *)&imageSet[1].super_Item.m_type,pcVar13);
      }
      parentItem = &imageSet->super_Item;
      std::__cxx11::string::clear();
      break;
    case TYPE_IMAGE:
      shaderProgram = (ShaderProgram *)ri::List::allocItem<xe::ri::Image>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&shaderProgram->shaders,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&shaderProgram->linkInfoLog,pcVar13);
      pcVar13 = getAttribute(this,"Width");
      iVar9 = toInt(pcVar13);
      *(int *)&(shaderProgram->linkInfoLog).log.field_2 = iVar9;
      pcVar13 = getAttribute(this,"Height");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&(shaderProgram->linkInfoLog).log.field_2 + 4) = iVar9;
      pcVar13 = getAttribute(this,"Format");
      FVar6 = getImageFormat(pcVar13);
      *(Format *)((long)&(shaderProgram->linkInfoLog).log.field_2 + 8) = FVar6;
      pcVar13 = getAttribute(this,"CompressionMode");
      CVar7 = getImageCompression(pcVar13);
      *(Compression *)((long)&(shaderProgram->linkInfoLog).log.field_2 + 0xc) = CVar7;
      parentItem = &shaderProgram->super_Item;
      break;
    case TYPE_IMAGESET:
      image = (Image *)ri::List::allocItem<xe::ri::ImageSet>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&image->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&image->description,pcVar13);
      parentItem = &image->super_Item;
      break;
    case TYPE_SHADER:
      if (local_3d4 != TYPE_SHADERPROGRAM) {
        shader._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"<",(allocator<char> *)((long)&shader + 7));
        std::operator+(&local_158,&local_178,local_18);
        std::operator+(&local_138,&local_158,"> outside of <ShaderProgram>");
        TestResultParseError::TestResultParseError(pTVar12,&local_138);
        shader._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      local_188 = ri::List::allocItem<xe::ri::Shader>(pLStack_c8);
      SVar8 = getShaderTypeFromTagName(local_18);
      *(ShaderType *)&(local_188->super_Item).field_0xc = SVar8;
      pcVar13 = getAttribute(this,"CompileStatus");
      bVar1 = toBool(pcVar13);
      local_188->compileStatus = bVar1;
      parentItem = &local_188->super_Item;
      break;
    case TYPE_SHADERPROGRAM:
      local_118 = ri::List::allocItem<xe::ri::ShaderProgram>(pLStack_c8);
      pcVar13 = getAttribute(this,"LinkStatus");
      bVar1 = toBool(pcVar13);
      local_118->linkStatus = bVar1;
      parentItem = &local_118->super_Item;
      break;
    case TYPE_SHADERSOURCE:
      if (local_3d4 != TYPE_SHADER) {
        local_212 = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"Unexpected <ShaderSource>",&local_211);
        TestResultParseError::TestResultParseError(pTVar12,&local_210);
        local_212 = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      parentItem = (Item *)&(pVStack_e0->name)._M_string_length;
      break;
    case TYPE_SPIRVSOURCE:
      if (local_3d4 != TYPE_SHADERPROGRAM) {
        local_1ea = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"<",&local_1e9);
        std::operator+(&local_1c8,&local_1e8,local_18);
        std::operator+(&local_1a8,&local_1c8,"> outside of <ShaderProgram>");
        TestResultParseError::TestResultParseError(pTVar12,&local_1a8);
        local_1ea = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      parentItem = &ri::List::allocItem<xe::ri::SpirVSource>(pLStack_c8)->super_Item;
      break;
    case TYPE_INFOLOG:
      if (local_3d4 == TYPE_SHADERPROGRAM) {
        parentItem = (Item *)&pVStack_e0->description;
      }
      else if (local_3d4 == TYPE_SHADER) {
        parentItem = (Item *)((long)&(pVStack_e0->description).field_2 + 8);
      }
      else {
        if (local_3d4 != TYPE_COMPILEINFO) {
          info._6_1_ = 1;
          pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"Unexpected <InfoLog>",
                     (allocator<char> *)((long)&info + 7));
          TestResultParseError::TestResultParseError(pTVar12,&local_238);
          info._6_1_ = 0;
          __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                      TestResultParseError::~TestResultParseError);
        }
        parentItem = (Item *)&(pVStack_e0->unit)._M_string_length;
      }
      break;
    case TYPE_EGLCONFIG:
      list = (SampleList *)ri::List::allocItem<xe::ri::EglConfig>(pLStack_c8);
      pcVar13 = getAttribute(this,"BufferSize");
      iVar9 = toInt(pcVar13);
      *(int *)&(list->super_Item).field_0xc = iVar9;
      pcVar13 = getAttribute(this,"RedSize");
      iVar9 = toInt(pcVar13);
      *(int *)&list->name = iVar9;
      pcVar13 = getAttribute(this,"GreenSize");
      iVar9 = toInt(pcVar13);
      *(int *)&(list->name).field_0x4 = iVar9;
      pcVar13 = getAttribute(this,"BlueSize");
      iVar9 = toInt(pcVar13);
      *(int *)&(list->name)._M_string_length = iVar9;
      pcVar13 = getAttribute(this,"LuminanceSize");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&(list->name)._M_string_length + 4) = iVar9;
      pcVar13 = getAttribute(this,"AlphaSize");
      iVar9 = toInt(pcVar13);
      *(int *)&(list->name).field_2 = iVar9;
      pcVar13 = getAttribute(this,"AlphaMaskSize");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&(list->name).field_2 + 4) = iVar9;
      pcVar13 = getAttribute(this,"BindToTextureRGB");
      bVar1 = toBool(pcVar13);
      (list->name).field_2._M_local_buf[8] = bVar1;
      pcVar13 = getAttribute(this,"BindToTextureRGBA");
      bVar1 = toBool(pcVar13);
      (list->name).field_2._M_local_buf[9] = bVar1;
      pcVar13 = getAttribute(this,"ColorBufferType");
      std::__cxx11::string::operator=((string *)&list->description,pcVar13);
      pcVar13 = getAttribute(this,"ConfigCaveat");
      std::__cxx11::string::operator=((string *)&list->sampleInfo,pcVar13);
      pcVar13 = getAttribute(this,"ConfigID");
      iVar9 = toInt(pcVar13);
      *(int *)&(list->sampleInfo).valueInfos.m_items.
               super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage = iVar9;
      pcVar13 = getAttribute(this,"Conformant");
      std::__cxx11::string::operator=((string *)&list->samples,pcVar13);
      pcVar13 = getAttribute(this,"DepthSize");
      TVar10 = toInt(pcVar13);
      list[1].super_Item.m_type = TVar10;
      pcVar13 = getAttribute(this,"Level");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].super_Item.field_0xc = iVar9;
      pcVar13 = getAttribute(this,"MaxPBufferWidth");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].name = iVar9;
      pcVar13 = getAttribute(this,"MaxPBufferHeight");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].name.field_0x4 = iVar9;
      pcVar13 = getAttribute(this,"MaxPBufferPixels");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].name._M_string_length = iVar9;
      pcVar13 = getAttribute(this,"MaxSwapInterval");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&list[1].name._M_string_length + 4) = iVar9;
      pcVar13 = getAttribute(this,"MinSwapInterval");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].name.field_2 = iVar9;
      pcVar13 = getAttribute(this,"NativeRenderable");
      bVar1 = toBool(pcVar13);
      list[1].name.field_2._M_local_buf[4] = bVar1;
      pcVar13 = getAttribute(this,"RenderableType");
      std::__cxx11::string::operator=((string *)(list[1].name.field_2._M_local_buf + 8),pcVar13);
      pcVar13 = getAttribute(this,"SampleBuffers");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&list[1].description.field_2 + 8) = iVar9;
      pcVar13 = getAttribute(this,"Samples");
      iVar9 = toInt(pcVar13);
      *(int *)((long)&list[1].description.field_2 + 0xc) = iVar9;
      pcVar13 = getAttribute(this,"StencilSize");
      iVar9 = toInt(pcVar13);
      *(int *)&list[1].sampleInfo.super_Item._vptr_Item = iVar9;
      pcVar13 = getAttribute(this,"SurfaceTypes");
      std::__cxx11::string::operator=((string *)&list[1].sampleInfo.super_Item.m_type,pcVar13);
      pcVar13 = getAttribute(this,"TransparentType");
      std::__cxx11::string::operator=((string *)&list[1].samples,pcVar13);
      pcVar13 = getAttribute(this,"TransparentRedValue");
      TVar10 = toInt(pcVar13);
      list[2].super_Item.m_type = TVar10;
      pcVar13 = getAttribute(this,"TransparentGreenValue");
      iVar9 = toInt(pcVar13);
      *(int *)&list[2].super_Item.field_0xc = iVar9;
      pcVar13 = getAttribute(this,"TransparentBlueValue");
      iVar9 = toInt(pcVar13);
      *(int *)&list[2].name = iVar9;
      parentItem = &list->super_Item;
      break;
    case TYPE_EGLCONFIGSET:
      config = (EglConfig *)ri::List::allocItem<xe::ri::EglConfigSet>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&config->redSize,pcVar13);
      bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,"Description");
      if (bVar1) {
        local_428 = xml::Parser::getAttribute(&this->m_xmlParser,"Description");
      }
      else {
        local_428 = "";
      }
      std::__cxx11::string::operator=((string *)&config->colorBufferType,local_428);
      parentItem = &config->super_Item;
      break;
    case TYPE_SECTION:
      number = (Number *)ri::List::allocItem<xe::ri::Section>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&number->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&number->description,pcVar13);
      parentItem = &number->super_Item;
      break;
    case TYPE_KERNELSOURCE:
      parentItem = &ri::List::allocItem<xe::ri::KernelSource>(pLStack_c8)->super_Item;
      break;
    case TYPE_COMPILEINFO:
      set = (EglConfigSet *)ri::List::allocItem<xe::ri::CompileInfo>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&set->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&set->description,pcVar13);
      pcVar13 = getAttribute(this,"CompileStatus");
      bVar1 = toBool(pcVar13);
      *(bool *)&(set->configs).m_items.
                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                super__Vector_impl_data._M_start = bVar1;
      parentItem = &set->super_Item;
      break;
    case TYPE_SAMPLELIST:
      local_260 = ri::List::allocItem<xe::ri::SampleList>(pLStack_c8);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&local_260->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&local_260->description,pcVar13);
      parentItem = &local_260->super_Item;
      break;
    case TYPE_SAMPLEINFO:
      if (local_3d4 != TYPE_SAMPLELIST) {
        list_1._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"<SampleInfo> outside of <SampleList>",
                   (allocator<char> *)((long)&list_1 + 7));
        TestResultParseError::TestResultParseError(pTVar12,&local_280);
        list_1._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      info_1 = (SampleInfo *)pVStack_e0;
      local_298 = &pVStack_e0->unit;
      parentItem = (Item *)local_298;
      break;
    case TYPE_VALUEINFO:
      if (local_3d4 != TYPE_SAMPLEINFO) {
        sampleInfo._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"<ValueInfo> outside of <SampleInfo>",
                   (allocator<char> *)((long)&sampleInfo + 7));
        TestResultParseError::TestResultParseError(pTVar12,&local_2b8);
        sampleInfo._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      valueInfo = pVStack_e0;
      local_2d0 = ri::List::allocItem<xe::ri::ValueInfo>((List *)&pVStack_e0->name);
      pcVar13 = getAttribute(this,"Name");
      std::__cxx11::string::operator=((string *)&local_2d0->name,pcVar13);
      pcVar13 = getAttribute(this,"Description");
      std::__cxx11::string::operator=((string *)&local_2d0->description,pcVar13);
      pcVar13 = getAttribute(this,"Tag");
      VVar11 = getSampleValueTag(pcVar13);
      local_2d0->tag = VVar11;
      bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,"Unit");
      if (bVar1) {
        pcVar13 = getAttribute(this,"Unit");
        std::__cxx11::string::operator=((string *)&local_2d0->unit,pcVar13);
      }
      parentItem = &local_2d0->super_Item;
      break;
    case TYPE_SAMPLE:
      if (local_3d4 != TYPE_SAMPLELIST) {
        list_2._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"<Sample> outside of <SampleList>",
                   (allocator<char> *)((long)&list_2 + 7));
        TestResultParseError::TestResultParseError(pTVar12,&local_2f0);
        list_2._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      sample = (Sample *)pVStack_e0;
      local_308 = ri::List::allocItem<xe::ri::Sample>((List *)(pVStack_e0 + 1));
      parentItem = &local_308->super_Item;
      break;
    case TYPE_SAMPLEVALUE:
      if (local_3d4 != TYPE_SAMPLE) {
        sample_1._6_1_ = 1;
        pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,"<Value> outside of <Sample>",
                   (allocator<char> *)((long)&sample_1 + 7));
        TestResultParseError::TestResultParseError(pTVar12,&local_328);
        sample_1._6_1_ = 0;
        __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                    TestResultParseError::~TestResultParseError);
      }
      value = (SampleValue *)pVStack_e0;
      local_340 = ri::List::allocItem<xe::ri::SampleValue>((List *)&pVStack_e0->name);
      parentItem = &local_340->super_Item;
      break;
    default:
      pTVar12 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"Unsupported element \'",&local_3a1);
      std::operator+(&local_380,&local_3a0,local_18);
      std::operator+(&local_360,&local_380,"\'");
      TestResultParseError::TestResultParseError(pTVar12,&local_360);
      __cxa_throw(pTVar12,&TestResultParseError::typeinfo,
                  TestResultParseError::~TestResultParseError);
    }
    pushItem(this,parentItem);
    this->m_base64DecodeOffset = 0;
  }
  return;
}

Assistant:

void TestResultParser::handleElementStart (void)
{
	const char* elemName = m_xmlParser.getElementName();

	if (m_state == STATE_INITIALIZED)
	{
		// Expect TestCaseResult.
		if (!deStringEqual(elemName, "TestCaseResult"))
			throw TestResultParseError(string("Expected <TestCaseResult>, got <") + elemName + ">");

		const char* version = getAttribute("Version");
		m_logVersion = getTestLogVersion(version);
		// \note Currently assumed that all known log versions are supported.

		m_result->casePath	= getAttribute("CasePath");
		m_result->caseType	= TESTCASETYPE_SELF_VALIDATE;

		if (m_xmlParser.hasAttribute("CaseType"))
			m_result->caseType = getTestCaseType(m_xmlParser.getAttribute("CaseType"));
		else
		{
			// Do guess based on path for legacy log files.
			if (m_logVersion >= TESTLOGVERSION_0_3_2)
				throw TestResultParseError("Missing CaseType attribute in <TestCaseResult>");
			m_result->caseType = getTestCaseTypeFromPath(m_result->casePath.c_str());
		}

		m_state = STATE_IN_TEST_CASE_RESULT;
	}
	else
	{
		ri::List*	curList		= getCurrentItemList();
		ri::Type	itemType	= getResultItemType(elemName);
		ri::Item*	item		= DE_NULL;
		ri::Item*	parentItem	= getCurrentItem();
		ri::Type	parentType	= parentItem ? parentItem->getType() : ri::TYPE_LAST;

		switch (itemType)
		{
			case ri::TYPE_RESULT:
			{
				ri::Result* result = curList->allocItem<ri::Result>();
				result->statusCode = getTestStatusCode(getAttribute("StatusCode"));
				item = result;
				break;
			}

			case ri::TYPE_TEXT:
				item = curList->allocItem<ri::Text>();
				break;

			case ri::TYPE_SECTION:
			{
				ri::Section* section = curList->allocItem<ri::Section>();
				section->name			= getAttribute("Name");
				section->description	= getAttribute("Description");
				item = section;
				break;
			}

			case ri::TYPE_NUMBER:
			{
				ri::Number* number = curList->allocItem<ri::Number>();
				number->name		= getAttribute("Name");
				number->description	= getAttribute("Description");
				number->unit		= getAttribute("Unit");

				if (m_xmlParser.hasAttribute("Tag"))
					number->tag = m_xmlParser.getAttribute("Tag");

				item = number;

				m_curNumValue.clear();
				break;
			}

			case ri::TYPE_IMAGESET:
			{
				ri::ImageSet* imageSet = curList->allocItem<ri::ImageSet>();
				imageSet->name			= getAttribute("Name");
				imageSet->description	= getAttribute("Description");
				item = imageSet;
				break;
			}

			case ri::TYPE_IMAGE:
			{
				ri::Image* image = curList->allocItem<ri::Image>();
				image->name			= getAttribute("Name");
				image->description	= getAttribute("Description");
				image->width		= toInt(getAttribute("Width"));
				image->height		= toInt(getAttribute("Height"));
				image->format		= getImageFormat(getAttribute("Format"));
				image->compression	= getImageCompression(getAttribute("CompressionMode"));
				item = image;
				break;
			}

			case ri::TYPE_SHADERPROGRAM:
			{
				ri::ShaderProgram* shaderProgram = curList->allocItem<ri::ShaderProgram>();
				shaderProgram->linkStatus = toBool(getAttribute("LinkStatus"));
				item = shaderProgram;
				break;
			}

			case ri::TYPE_SHADER:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");

				ri::Shader* shader = curList->allocItem<ri::Shader>();

				shader->shaderType		= getShaderTypeFromTagName(elemName);
				shader->compileStatus	= toBool(getAttribute("CompileStatus"));

				item = shader;
				break;
			}

			case ri::TYPE_SPIRVSOURCE:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");
				item = curList->allocItem<ri::SpirVSource>();
				break;
			}

			case ri::TYPE_SHADERSOURCE:
				if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->source;
				else
					throw TestResultParseError("Unexpected <ShaderSource>");
				break;

			case ri::TYPE_INFOLOG:
				if (parentType == ri::TYPE_SHADERPROGRAM)
					item = &static_cast<ri::ShaderProgram*>(parentItem)->linkInfoLog;
				else if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->infoLog;
				else if (parentType == ri::TYPE_COMPILEINFO)
					item = &static_cast<ri::CompileInfo*>(parentItem)->infoLog;
				else
					throw TestResultParseError("Unexpected <InfoLog>");
				break;

			case ri::TYPE_KERNELSOURCE:
				item = curList->allocItem<ri::KernelSource>();
				break;

			case ri::TYPE_COMPILEINFO:
			{
				ri::CompileInfo* info = curList->allocItem<ri::CompileInfo>();
				info->name			= getAttribute("Name");
				info->description	= getAttribute("Description");
				info->compileStatus	= toBool(getAttribute("CompileStatus"));
				item = info;
				break;
			}

			case ri::TYPE_EGLCONFIGSET:
			{
				ri::EglConfigSet* set = curList->allocItem<ri::EglConfigSet>();
				set->name			= getAttribute("Name");
				set->description	= m_xmlParser.hasAttribute("Description") ? m_xmlParser.getAttribute("Description") : "";
				item = set;
				break;
			}

			case ri::TYPE_EGLCONFIG:
			{
				ri::EglConfig* config = curList->allocItem<ri::EglConfig>();
				config->bufferSize				= toInt(getAttribute("BufferSize"));
				config->redSize					= toInt(getAttribute("RedSize"));
				config->greenSize				= toInt(getAttribute("GreenSize"));
				config->blueSize				= toInt(getAttribute("BlueSize"));
				config->luminanceSize			= toInt(getAttribute("LuminanceSize"));
				config->alphaSize				= toInt(getAttribute("AlphaSize"));
				config->alphaMaskSize			= toInt(getAttribute("AlphaMaskSize"));
				config->bindToTextureRGB		= toBool(getAttribute("BindToTextureRGB"));
				config->bindToTextureRGBA		= toBool(getAttribute("BindToTextureRGBA"));
				config->colorBufferType			= getAttribute("ColorBufferType");
				config->configCaveat			= getAttribute("ConfigCaveat");
				config->configID				= toInt(getAttribute("ConfigID"));
				config->conformant				= getAttribute("Conformant");
				config->depthSize				= toInt(getAttribute("DepthSize"));
				config->level					= toInt(getAttribute("Level"));
				config->maxPBufferWidth			= toInt(getAttribute("MaxPBufferWidth"));
				config->maxPBufferHeight		= toInt(getAttribute("MaxPBufferHeight"));
				config->maxPBufferPixels		= toInt(getAttribute("MaxPBufferPixels"));
				config->maxSwapInterval			= toInt(getAttribute("MaxSwapInterval"));
				config->minSwapInterval			= toInt(getAttribute("MinSwapInterval"));
				config->nativeRenderable		= toBool(getAttribute("NativeRenderable"));
				config->renderableType			= getAttribute("RenderableType");
				config->sampleBuffers			= toInt(getAttribute("SampleBuffers"));
				config->samples					= toInt(getAttribute("Samples"));
				config->stencilSize				= toInt(getAttribute("StencilSize"));
				config->surfaceTypes			= getAttribute("SurfaceTypes");
				config->transparentType			= getAttribute("TransparentType");
				config->transparentRedValue		= toInt(getAttribute("TransparentRedValue"));
				config->transparentGreenValue	= toInt(getAttribute("TransparentGreenValue"));
				config->transparentBlueValue	= toInt(getAttribute("TransparentBlueValue"));
				item = config;
				break;
			}

			case ri::TYPE_SAMPLELIST:
			{
				ri::SampleList* list = curList->allocItem<ri::SampleList>();
				list->name			= getAttribute("Name");
				list->description	= getAttribute("Description");
				item = list;
				break;
			}

			case ri::TYPE_SAMPLEINFO:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<SampleInfo> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::SampleInfo*	info	= &list->sampleInfo;

				item = info;
				break;
			}

			case ri::TYPE_VALUEINFO:
			{
				if (parentType != ri::TYPE_SAMPLEINFO)
					throw TestResultParseError("<ValueInfo> outside of <SampleInfo>");

				ri::SampleInfo*	sampleInfo	= static_cast<ri::SampleInfo*>(parentItem);
				ri::ValueInfo*	valueInfo	= sampleInfo->valueInfos.allocItem<ri::ValueInfo>();

				valueInfo->name			= getAttribute("Name");
				valueInfo->description	= getAttribute("Description");
				valueInfo->tag			= getSampleValueTag(getAttribute("Tag"));

				if (m_xmlParser.hasAttribute("Unit"))
					valueInfo->unit = getAttribute("Unit");

				item = valueInfo;
				break;
			}

			case ri::TYPE_SAMPLE:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<Sample> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::Sample*		sample	= list->samples.allocItem<ri::Sample>();

				item = sample;
				break;
			}

			case ri::TYPE_SAMPLEVALUE:
			{
				if (parentType != ri::TYPE_SAMPLE)
					throw TestResultParseError("<Value> outside of <Sample>");

				ri::Sample*			sample	= static_cast<ri::Sample*>(parentItem);
				ri::SampleValue*	value	= sample->values.allocItem<ri::SampleValue>();

				item = value;
				break;
			}

			default:
				throw TestResultParseError(string("Unsupported element '") + elemName + ("'"));
		}

		DE_ASSERT(item);
		pushItem(item);

		// Reset base64 decoding offset.
		m_base64DecodeOffset = 0;
	}
}